

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O2

void __thiscall
Js::ScriptFunctionWithInlineCache::AllocateInlineCache(ScriptFunctionWithInlineCache *this)

{
  uint uVar1;
  Type TVar2;
  ThreadContext *this_00;
  code *pcVar3;
  bool bVar4;
  PropertyId PVar5;
  undefined4 *puVar6;
  FunctionBody *this_01;
  FunctionBody *this_02;
  ScriptContext *pSVar7;
  Recycler *pRVar8;
  void **ptr;
  uchar *puVar9;
  void *pvVar10;
  RootObjectBase *this_03;
  PropertyRecord *pPVar11;
  InlineCache *pIVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  void **ppvVar16;
  ulong count;
  undefined1 local_98 [8];
  TrackAllocData data;
  
  if ((this->m_inlineCaches).ptr != (void **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x2d8,"(this->m_inlineCaches == nullptr)",
                                "this->m_inlineCaches == nullptr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  uVar1 = this->inlineCacheCount;
  TVar2 = this->isInstInlineCacheCount;
  this_01 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
  uVar13 = TVar2 + uVar1;
  if (uVar13 != 0) {
    data._32_8_ = (ulong)uVar1;
    this_02 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
    pSVar7 = FunctionProxy::GetScriptContext((FunctionProxy *)this_02);
    count = (ulong)uVar13;
    local_98 = (undefined1  [8])&void*::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_8b8f4dc;
    data.filename._0_4_ = 0x2e2;
    data.plusSize = count;
    pRVar8 = Memory::Recycler::TrackAllocInfo(pSVar7->recycler,(TrackAllocData *)local_98);
    ptr = Memory::AllocateArray<Memory::Recycler,void*,false>
                    ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocZero,0,count);
    local_98 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_8b8f4dc;
    data.filename._0_4_ = 0x2e5;
    data.plusSize = count;
    pRVar8 = Memory::Recycler::TrackAllocInfo(pSVar7->recycler,(TrackAllocData *)local_98);
    puVar9 = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                       ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocLeafZero,0,count);
    Memory::WriteBarrierPtr<unsigned_char>::WriteBarrierSet(&this->m_inlineCacheTypes,puVar9);
    uVar14 = (ulong)this->rootObjectLoadInlineCacheStart;
    for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
      pvVar10 = new<Memory::InlineCacheAllocator>(0x20,&pSVar7->inlineCacheAllocator,0x6dbe44);
      ptr[uVar15] = pvVar10;
    }
    this_03 = FunctionBody::GetRootObject(this_01);
    this_00 = pSVar7->threadContext;
    uVar1 = this->rootObjectLoadMethodInlineCacheStart;
    ppvVar16 = ptr + uVar14;
    for (; uVar14 < uVar1; uVar14 = uVar14 + 1) {
      PVar5 = FunctionBody::GetPropertyIdFromCacheId(this_01,(uint)uVar14);
      pPVar11 = ThreadContext::GetPropertyName(this_00,PVar5);
      pIVar12 = RootObjectBase::GetInlineCache(this_03,pPVar11,false,false);
      *ppvVar16 = pIVar12;
      ppvVar16 = ppvVar16 + 1;
    }
    uVar1 = this->rootObjectStoreInlineCacheStart;
    for (; uVar14 < uVar1; uVar14 = uVar14 + 1) {
      PVar5 = FunctionBody::GetPropertyIdFromCacheId(this_01,(uint)uVar14);
      pPVar11 = ThreadContext::GetPropertyName(this_00,PVar5);
      pIVar12 = RootObjectBase::GetInlineCache(this_03,pPVar11,true,false);
      *ppvVar16 = pIVar12;
      ppvVar16 = ppvVar16 + 1;
    }
    for (; uVar14 < (ulong)data._32_8_; uVar14 = uVar14 + 1) {
      PVar5 = FunctionBody::GetPropertyIdFromCacheId(this_01,(uint)uVar14);
      pPVar11 = ThreadContext::GetPropertyName(this_00,PVar5);
      pIVar12 = RootObjectBase::GetInlineCache(this_03,pPVar11,false,true);
      *ppvVar16 = pIVar12;
      ppvVar16 = ppvVar16 + 1;
    }
    for (; pSVar7 = FunctionProxy::GetScriptContext((FunctionProxy *)this_01), uVar14 < count;
        uVar14 = uVar14 + 1) {
      pvVar10 = new<Memory::CacheAllocator>(0x20,&pSVar7->isInstInlineCacheAllocator,0x6dbcf8);
      *ppvVar16 = pvVar10;
      ppvVar16 = ppvVar16 + 1;
    }
    local_98 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_8b8f4dc;
    data.filename._0_4_ = 0x30e;
    data.plusSize = count;
    pRVar8 = Memory::Recycler::TrackAllocInfo(pSVar7->recycler,(TrackAllocData *)local_98);
    puVar9 = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                       ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocLeafZero,0,count);
    Memory::WriteBarrierPtr<unsigned_char>::WriteBarrierSet(&this->m_inlineCacheTypes,puVar9);
    Memory::WriteBarrierPtr<void_*>::WriteBarrierSet(&this->m_inlineCaches,ptr);
  }
  return;
}

Assistant:

void ScriptFunctionWithInlineCache::AllocateInlineCache()
    {
        Assert(this->m_inlineCaches == nullptr);
        uint isInstInlineCacheStart = this->GetInlineCacheCount();
        uint totalCacheCount = isInstInlineCacheStart + isInstInlineCacheCount;
        Js::FunctionBody* functionBody = this->GetFunctionBody();

        if (totalCacheCount != 0)
        {
            // Root object inline cache are not leaf
            Js::ScriptContext* scriptContext = this->GetFunctionBody()->GetScriptContext();
            void ** inlineCaches = RecyclerNewArrayZ(scriptContext->GetRecycler() ,
                void*, totalCacheCount);
#if DBG
            this->m_inlineCacheTypes = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(),
                byte, totalCacheCount);
#endif
            uint i = 0;
            uint plainInlineCacheEnd = rootObjectLoadInlineCacheStart;
            __analysis_assume(plainInlineCacheEnd <= totalCacheCount);
            for (; i < plainInlineCacheEnd; i++)
            {
                inlineCaches[i] = AllocatorNewZ(InlineCacheAllocator,
                    scriptContext->GetInlineCacheAllocator(), InlineCache);
            }
            Js::RootObjectBase * rootObject = functionBody->GetRootObject();
            ThreadContext * threadContext = scriptContext->GetThreadContext();
            uint rootObjectLoadInlineCacheEnd = rootObjectLoadMethodInlineCacheStart;
            __analysis_assume(rootObjectLoadInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectLoadInlineCacheEnd; i++)
            {
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(functionBody->GetPropertyIdFromCacheId(i)), false, false);
            }
            uint rootObjectLoadMethodInlineCacheEnd = rootObjectStoreInlineCacheStart;
            __analysis_assume(rootObjectLoadMethodInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectLoadMethodInlineCacheEnd; i++)
            {
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(functionBody->GetPropertyIdFromCacheId(i)), true, false);
            }
            uint rootObjectStoreInlineCacheEnd = isInstInlineCacheStart;
            __analysis_assume(rootObjectStoreInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectStoreInlineCacheEnd; i++)
            {
#pragma prefast(suppress:6386, "The analysis assume didn't help prefast figure out this is in range")
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(functionBody->GetPropertyIdFromCacheId(i)), false, true);
            }
            for (; i < totalCacheCount; i++)
            {
                inlineCaches[i] = AllocatorNewStructZ(CacheAllocator,
                    functionBody->GetScriptContext()->GetIsInstInlineCacheAllocator(), IsInstInlineCache);
            }
#if DBG
            this->m_inlineCacheTypes = RecyclerNewArrayLeafZ(functionBody->GetScriptContext()->GetRecycler(),
                byte, totalCacheCount);
#endif
            this->m_inlineCaches = inlineCaches;
        }
    }